

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)33>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  undefined8 this_00;
  bool bVar1;
  MemoryExpr<(wabt::ExprType)33> *this_01;
  Var local_e0;
  undefined4 local_94;
  size_t local_90;
  char *local_88;
  size_t local_80;
  undefined8 local_78;
  Enum local_6c;
  undefined1 local_68 [8];
  Var memidx;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  memidx.field_2._24_8_ = out_expr;
  Var::Var((Var *)local_68);
  local_90 = loc.filename._M_len;
  local_88 = loc.filename._M_str;
  local_80 = (size_t)loc.field_1.field_1.offset;
  local_78 = loc.field_1._8_8_;
  local_6c = (Enum)ParseMemidx(this,loc,(Var *)local_68);
  bVar1 = Failed((Result)local_6c);
  this_00 = memidx.field_2._24_8_;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_01 = (MemoryExpr<(wabt::ExprType)33> *)operator_new(0x88);
    Var::Var(&local_e0,(Var *)local_68);
    MemoryExpr<(wabt::ExprType)33>::MemoryExpr(this_01,&local_e0,&loc);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)this_00,(pointer)this_01)
    ;
    Var::~Var(&local_e0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  local_94 = 1;
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemoryExpr(Location loc,
                                   std::unique_ptr<Expr>* out_expr) {
  Var memidx;
  CHECK_RESULT(ParseMemidx(loc, &memidx));
  out_expr->reset(new T(memidx, loc));
  return Result::Ok;
}